

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O0

bool __thiscall duckdb::SQLLogicParser::OpenFile(SQLLogicParser *this,string *path)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  string *in_RSI;
  string *in_RDI;
  string line;
  ifstream infile;
  value_type *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  undefined4 local_230;
  istream local_220 [543];
  byte local_1;
  
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::ifstream::ifstream(local_220,in_RDI,_S_in);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string(local_250);
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar2) break;
        std::__cxx11::string::string(local_290,local_250);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,"\r",&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,anon_var_dwarf_65e8f3 + 9,&local_2d9);
        duckdb::StringUtil::Replace(local_270,local_290,local_2b0,local_2d8);
        Catch::clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string(local_270);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::__cxx11::string::~string(local_290);
      }
      bVar1 = std::ios::bad();
      local_1 = (bVar1 ^ 0xff) & 1;
      local_230 = 1;
      std::__cxx11::string::~string(local_250);
      goto LAB_007cc0d4;
    }
  }
  local_1 = 0;
  local_230 = 1;
LAB_007cc0d4:
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool SQLLogicParser::OpenFile(const string &path) {
	this->file_name = path;

	std::ifstream infile(file_name);
	if (infile.bad() || infile.fail()) {
		return false;
	}

	string line;
	while (std::getline(infile, line)) {
		lines.push_back(StringUtil::Replace(line, "\r", ""));
	}
	return !infile.bad();
}